

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_null.cpp
# Opt level: O1

void __thiscall driver::context_t::context_t(context_t *this)

{
  this->version = ZE_API_VERSION_1_13;
  memset(&this->zeDdiTable,0,0xd28);
  (this->zesDdiTable).Driver.pfnGet = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Driver.pfnGet = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGet = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Driver.pfnGetApiVersion = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Driver.pfnGetProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Mem.pfnAllocShared = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Mem.pfnAllocDevice = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Mem.pfnAllocHost = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Mem.pfnFree = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetComputeProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetCommandQueueGroupProperties =
       context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetMemoryProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetMemoryAccessProperties =
       context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetCacheProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Device.pfnGetImageProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zeDdiTable).Driver.pfnGetExtensionProperties = context_t::anon_class_1_0_00000001::__invoke
  ;
  (this->zetDdiTable).MetricGroup.pfnGet = context_t::anon_class_1_0_00000001::__invoke;
  (this->zetDdiTable).MetricGroup.pfnGetProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zetDdiTable).MetricGroup.pfnCalculateMetricValues =
       context_t::anon_class_1_0_00000001::__invoke;
  (this->zetDdiTable).Metric.pfnGet = context_t::anon_class_1_0_00000001::__invoke;
  (this->zetDdiTable).Metric.pfnGetProperties = context_t::anon_class_1_0_00000001::__invoke;
  (this->zetDdiTable).MetricQuery.pfnGetData = context_t::anon_class_1_0_00000001::__invoke;
  (this->zetDdiTable).MetricStreamer.pfnReadData = context_t::anon_class_1_0_00000001::__invoke;
  return;
}

Assistant:

context_t::context_t()
    {
        zesDdiTable.Driver.pfnGet = [](
            uint32_t* pCount,
            ze_driver_handle_t* phDrivers )
        {
            *pCount = 1;
            if( nullptr != phDrivers ) *reinterpret_cast<void**>( phDrivers ) = context.get();
            return ZE_RESULT_SUCCESS;
        };
        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGet = [](
            uint32_t* pCount,
            ze_driver_handle_t* phDrivers )
        {
            *pCount = 1;
            if( nullptr != phDrivers ) *reinterpret_cast<void**>( phDrivers ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGet = [](
            ze_driver_handle_t,
            uint32_t* pCount,
            ze_device_handle_t* phDevices )
        {
            *pCount = 1;
            if( nullptr != phDevices ) *reinterpret_cast<void**>( phDevices ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //pfnCreateEventPool

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGetApiVersion = [](
            ze_driver_handle_t,
            ze_api_version_t* version )
        {
            *version = context.version;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGetProperties = [](
            ze_driver_handle_t,
            ze_driver_properties_t* pDriverProperties )
        {
            ze_driver_properties_t driverProperties = {};
            driverProperties.stype = ZE_STRUCTURE_TYPE_DRIVER_PROPERTIES;
            //driverProperties.uuid
            driverProperties.driverVersion = 0;

            *pDriverProperties = driverProperties;
            return ZE_RESULT_SUCCESS;
        };

        //pfnGetIPCProperties
        
        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnAllocShared = [](
            ze_context_handle_t,
            const ze_device_mem_alloc_desc_t*,
            const ze_host_mem_alloc_desc_t*,
            size_t size,
            size_t alignment,
            ze_device_handle_t,
            void** pptr)
        {
            *pptr = malloc(size);
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnAllocDevice = [](
            ze_context_handle_t,
            const ze_device_mem_alloc_desc_t*,
            size_t size,
            size_t alignment,
            ze_device_handle_t,
            void** pptr)
        {
            *pptr = malloc(size);
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnAllocHost = [](
            ze_context_handle_t,
            const ze_host_mem_alloc_desc_t*,
            size_t size,
            size_t alignment,
            void** pptr)
        {
            *pptr = malloc(size);
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Mem.pfnFree = [](
            ze_context_handle_t,
            void* ptr)
        {
            free(ptr);
            return ZE_RESULT_SUCCESS;
        };

        //pfnGetMemProperties
        //pfnGetMemAddressRange
        //pfnGetMemIpcHandle
        //pfnOpenMemIpcHandle
        //pfnCloseMemIpcHandle

        //////////////////////////////////////////////////////////////////////////
        //pfnGetSubDevices

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetProperties = [](
            ze_device_handle_t,
            ze_device_properties_t* pDeviceProperties )
        {
            ze_device_properties_t deviceProperties = {};
            deviceProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_PROPERTIES;
            deviceProperties.type = ZE_DEVICE_TYPE_GPU;
            auto driver_type = getenv_string( "ZEL_TEST_NULL_DRIVER_TYPE" );
            if (std::strcmp(driver_type.c_str(), "NPU") == 0) {
                deviceProperties.type = ZE_DEVICE_TYPE_VPU;
            }
#if defined(_WIN32)
            strcpy_s( deviceProperties.name, "Null Device" );
#else
            strcpy( deviceProperties.name, "Null Device" );
#endif

            *pDeviceProperties = deviceProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetComputeProperties = [](
            ze_device_handle_t,
            ze_device_compute_properties_t* pComputeProperties )
        {
            ze_device_compute_properties_t computeProperties = {};
            computeProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_COMPUTE_PROPERTIES;

            *pComputeProperties = computeProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetCommandQueueGroupProperties = [](
            ze_device_handle_t,
            uint32_t* pCount,
            ze_command_queue_group_properties_t* pCommandQueueGroupProperties )
        {
            if( nullptr != pCommandQueueGroupProperties )
            {
                ze_command_queue_group_properties_t commandQueueGroupProperties = {};
                commandQueueGroupProperties.stype = ZE_STRUCTURE_TYPE_COMMAND_QUEUE_GROUP_PROPERTIES;
                commandQueueGroupProperties.flags =
                    ZE_COMMAND_QUEUE_GROUP_PROPERTY_FLAG_COPY |
                    ZE_COMMAND_QUEUE_GROUP_PROPERTY_FLAG_COMPUTE;

                *pCommandQueueGroupProperties = commandQueueGroupProperties;
            }
            *pCount = 1;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetMemoryProperties = [](
            ze_device_handle_t,
            uint32_t* pCount,
            ze_device_memory_properties_t* pMemProperties )
        {
            ze_device_memory_properties_t memoryProperties = {};
            memoryProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_MEMORY_PROPERTIES;

            *pCount = 1;
            if( nullptr != pMemProperties ) *pMemProperties = memoryProperties;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetMemoryAccessProperties = [](
            ze_device_handle_t,
            ze_device_memory_access_properties_t* pMemAccessProperties )
        {
            ze_device_memory_access_properties_t memoryAccessProperties = {};
            memoryAccessProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_MEMORY_ACCESS_PROPERTIES;

            *pMemAccessProperties = memoryAccessProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetCacheProperties = [](
            ze_device_handle_t,
            uint32_t* pCount,
            ze_device_cache_properties_t* pCacheProperties )
        {
            if( nullptr != pCacheProperties )
            {
                ze_device_cache_properties_t cacheProperties = {};
                cacheProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_CACHE_PROPERTIES;

                *pCacheProperties = cacheProperties;
            }
            *pCount = 1;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Device.pfnGetImageProperties = [](
            ze_device_handle_t,
            ze_device_image_properties_t* pImageProperties )
        {
            ze_device_image_properties_t imageProperties = {};
            imageProperties.stype = ZE_STRUCTURE_TYPE_DEVICE_IMAGE_PROPERTIES;

            *pImageProperties = imageProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zeDdiTable.Driver.pfnGetExtensionProperties = [](
            ze_driver_handle_t,
            uint32_t* pCount,
            ze_driver_extension_properties_t* pExtensionProperties )
        {
            if( nullptr != pExtensionProperties )
            {
                ze_driver_extension_properties_t driverExtensionProperties = {};
#if defined(_WIN32)
                strcpy_s( driverExtensionProperties.name, ZET_API_TRACING_EXP_NAME );
#else
                strcpy( driverExtensionProperties.name, ZET_API_TRACING_EXP_NAME );
#endif
                driverExtensionProperties.version = ZET_API_TRACING_EXP_VERSION_1_0;

                *pExtensionProperties = driverExtensionProperties;
            }
            *pCount = 1;

            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricGroup.pfnGet = [](
            zet_device_handle_t,
            uint32_t* pCount,
            zet_metric_group_handle_t* phMetricGroups )
        {
            *pCount = 1;
            if( nullptr != phMetricGroups ) *reinterpret_cast<void**>( phMetricGroups ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricGroup.pfnGetProperties = [](
            zet_metric_group_handle_t,
            zet_metric_group_properties_t* pProperties )
        {
            zet_metric_group_properties_t metricGroupProperties = {};
            metricGroupProperties.stype = ZET_STRUCTURE_TYPE_METRIC_GROUP_PROPERTIES;
            metricGroupProperties.metricCount = 1;
            metricGroupProperties.samplingType = 
                ZET_METRIC_GROUP_SAMPLING_TYPE_FLAG_EVENT_BASED |
                ZET_METRIC_GROUP_SAMPLING_TYPE_FLAG_TIME_BASED;
#if defined(_WIN32)
            strcpy_s( metricGroupProperties.name, "Null Metric Group" );
#else
            strcpy( metricGroupProperties.name, "Null Metric Group" );
#endif

            *pProperties = metricGroupProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricGroup.pfnCalculateMetricValues = [](
            zet_metric_group_handle_t,
            zet_metric_group_calculation_type_t,
            size_t,
            const uint8_t*,
            uint32_t* pMetricValueCount,
            zet_typed_value_t* pMetricValues )
        {
            *pMetricValueCount = 1;
            if( pMetricValues ) *pMetricValues = {};
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.Metric.pfnGet = [](
            zet_metric_group_handle_t,
            uint32_t* pCount,
            zet_metric_handle_t* phMetrics )
        {
            *pCount = 1;
            if( nullptr != phMetrics ) *reinterpret_cast<void**>( phMetrics ) = context.get();
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.Metric.pfnGetProperties = [](
            zet_metric_handle_t,
            zet_metric_properties_t* pProperties )
        {
            zet_metric_properties_t metricProperties = {};
            metricProperties.stype = ZET_STRUCTURE_TYPE_METRIC_PROPERTIES;
            metricProperties.metricType = ZET_METRIC_TYPE_DURATION;
            metricProperties.resultType = ZET_VALUE_TYPE_UINT32;
#if defined(_WIN32)
            strcpy_s( metricProperties.name, "Null Metric" );
            strcpy_s( metricProperties.resultUnits, "ns" );

#else
            strcpy( metricProperties.name, "Null Metric" );
            strcpy( metricProperties.resultUnits, "ns" );
#endif
            
            *pProperties = metricProperties;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricQuery.pfnGetData = [](
            zet_metric_query_handle_t,
            size_t* pRawDataSize,
            uint8_t* pRawData )
        {
            *pRawDataSize = 1;
            if( pRawData ) *pRawData = 0;
            return ZE_RESULT_SUCCESS;
        };

        //////////////////////////////////////////////////////////////////////////
        zetDdiTable.MetricStreamer.pfnReadData = [](
            zet_metric_streamer_handle_t,
            uint32_t,
            size_t* pRawDataSize,
            uint8_t* pRawData )
        {
            *pRawDataSize = 1;
            if( pRawData ) *pRawData = 0;
            return ZE_RESULT_SUCCESS;
        };
    }